

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall
QPDF::pushOutlinesToPart<QPDFWriter::ObjTable>
          (QPDF *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *lc_outlines,
          ObjTable *object_stream_data)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  int local_10c;
  value_type local_c8;
  reference local_b8;
  QPDFObjGen *og;
  iterator __end1;
  iterator __begin1;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *__range1;
  QPDFObjGen outlines_og;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  QPDFObjectHandle outlines;
  QPDFObjectHandle root;
  ObjTable *object_stream_data_local;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *lc_outlines_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part_local;
  QPDF *this_local;
  
  getRoot((QPDF *)&outlines.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/Outlines",&local_69);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)local_48,
             (string *)
             &outlines.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_48);
  if (!bVar1) {
    getUncompressedObject((QPDF *)&outlines_og,(QPDFObjectHandle *)this,(ObjTable *)local_48);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_48,(QPDFObjectHandle *)&outlines_og);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&outlines_og);
    __range1 = (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
               QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_48);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    if (part == &pMVar3->part6) {
      local_10c = 0;
    }
    else {
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      local_10c = 9999;
      if (part == &pMVar3->part9) {
        local_10c = 1;
      }
    }
    QTC::TC("qpdf","QPDF lin outlines in part",local_10c);
    iVar2 = QPDFObjGen::getObj((QPDFObjGen *)&__range1);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    (pMVar3->c_outline_data).first_object = iVar2;
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    (pMVar3->c_outline_data).nobjects = 1;
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::erase
              (lc_outlines,(QPDFObjGen *)&__range1);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              (part,(value_type *)local_48);
    __end1 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::begin
                       (lc_outlines);
    og = (QPDFObjGen *)
         std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::end(lc_outlines);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&og), bVar1) {
      local_b8 = std::_Rb_tree_const_iterator<QPDFObjGen>::operator*(&__end1);
      getObject((QPDF *)&local_c8,(QPDFObjGen)this);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back(part,&local_c8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_c8);
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      (pMVar3->c_outline_data).nobjects = (pMVar3->c_outline_data).nobjects + 1;
      std::_Rb_tree_const_iterator<QPDFObjGen>::operator++(&__end1);
    }
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &outlines.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDF::pushOutlinesToPart(
    std::vector<QPDFObjectHandle>& part,
    std::set<QPDFObjGen>& lc_outlines,
    T const& object_stream_data)
{
    QPDFObjectHandle root = getRoot();
    QPDFObjectHandle outlines = root.getKey("/Outlines");
    if (outlines.isNull()) {
        return;
    }
    outlines = getUncompressedObject(outlines, object_stream_data);
    QPDFObjGen outlines_og(outlines.getObjGen());
    QTC::TC(
        "qpdf",
        "QPDF lin outlines in part",
        ((&part == (&m->part6))       ? 0
             : (&part == (&m->part9)) ? 1
                                      : 9999)); // can't happen
    m->c_outline_data.first_object = outlines_og.getObj();
    m->c_outline_data.nobjects = 1;
    lc_outlines.erase(outlines_og);
    part.push_back(outlines);
    for (auto const& og: lc_outlines) {
        part.push_back(getObject(og));
        ++m->c_outline_data.nobjects;
    }
}